

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O3

void If_CutPropagateRequired(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut,float ObjRequired)

{
  uint uVar1;
  If_Par_t *pIVar2;
  If_LibLut_t *pIVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  char Perm [15];
  float local_2f [3];
  
  pIVar2 = p->pPars;
  if (pIVar2->fLiftLeaves != 0) {
    __assert_fail("!p->pPars->fLiftLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                  ,0xba,"void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)");
  }
  uVar1 = *(uint *)&pCut->field_0x1c;
  if ((short)uVar1 < 0) {
    if (0xffffff < uVar1) {
      pVVar4 = p->vObjs;
      uVar7 = 0;
      do {
        fVar11 = (&pCut[1].Area)[uVar7];
        if (((long)(int)fVar11 < 0) || (pVVar4->nSize <= (int)fVar11)) goto LAB_00436faf;
        pvVar5 = pVVar4->pArray[(int)fVar11];
        if (pvVar5 == (void *)0x0) {
          return;
        }
        fVar10 = ObjRequired - (float)pIVar2->nAndDelay;
        fVar11 = *(float *)((long)pvVar5 + 0x34);
        if (fVar10 <= *(float *)((long)pvVar5 + 0x34)) {
          fVar11 = fVar10;
        }
        *(float *)((long)pvVar5 + 0x34) = fVar11;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (byte)pCut->field_0x1f);
    }
  }
  else {
    pIVar3 = pIVar2->pLutLib;
    if (pIVar3 == (If_LibLut_t *)0x0) {
      if ((uVar1 >> 0xd & 1) == 0) {
        if (0xffffff < uVar1) {
          pVVar4 = p->vObjs;
          uVar7 = 0;
          do {
            fVar11 = (&pCut[1].Area)[uVar7];
            if (((long)(int)fVar11 < 0) || (pVVar4->nSize <= (int)fVar11)) goto LAB_00436faf;
            pvVar5 = pVVar4->pArray[(int)fVar11];
            if (pvVar5 == (void *)0x0) {
              return;
            }
            fVar11 = *(float *)((long)pvVar5 + 0x34);
            if (ObjRequired + -1.0 <= *(float *)((long)pvVar5 + 0x34)) {
              fVar11 = ObjRequired + -1.0;
            }
            *(float *)((long)pvVar5 + 0x34) = fVar11;
            uVar7 = uVar7 + 1;
          } while (uVar7 < (byte)pCut->field_0x1f);
        }
      }
      else {
        if (pIVar2->fDelayOpt == 0) {
          if (pIVar2->fDelayOptLut == 0) {
            if (pIVar2->fDsdBalance == 0) {
              pfVar9 = &pCut[1].Area + (uVar1 >> 0x18);
            }
            else {
              pfVar9 = local_2f;
              iVar6 = If_CutDsdBalancePinDelays(p,pCut,(char *)pfVar9);
              if (iVar6 != (int)pCut->Delay) {
                __assert_fail("Delay == (int)pCut->Delay",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                              ,0xe8,
                              "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)"
                             );
              }
            }
          }
          else {
            pfVar9 = local_2f;
            iVar6 = If_CutLutBalancePinDelays(p,pCut,(char *)pfVar9);
            if (iVar6 != (int)pCut->Delay) {
              __assert_fail("Delay == (int)pCut->Delay",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                            ,0xe3,
                            "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)"
                           );
            }
          }
        }
        else {
          pfVar9 = local_2f;
          iVar6 = If_CutSopBalancePinDelays(p,pCut,(char *)pfVar9);
          if (iVar6 != (int)pCut->Delay) {
            __assert_fail("Delay == (int)pCut->Delay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                          ,0xde,
                          "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)")
            ;
          }
        }
        if (0xffffff < *(uint *)&pCut->field_0x1c) {
          pVVar4 = p->vObjs;
          uVar7 = 0;
          do {
            fVar11 = (&pCut[1].Area)[uVar7];
            if (((long)(int)fVar11 < 0) || (pVVar4->nSize <= (int)fVar11)) goto LAB_00436faf;
            pvVar5 = pVVar4->pArray[(int)fVar11];
            if (pvVar5 == (void *)0x0) {
              return;
            }
            fVar11 = -120.0;
            if (*(char *)((long)pfVar9 + uVar7) != 'x') {
              fVar11 = (float)(int)*(char *)((long)pfVar9 + uVar7);
            }
            fVar10 = *(float *)((long)pvVar5 + 0x34);
            if (ObjRequired - fVar11 <= *(float *)((long)pvVar5 + 0x34)) {
              fVar10 = ObjRequired - fVar11;
            }
            *(float *)((long)pvVar5 + 0x34) = fVar10;
            uVar7 = uVar7 + 1;
          } while (uVar7 < (byte)pCut->field_0x1f);
        }
      }
    }
    else {
      pfVar9 = (float *)((long)pIVar3->pLutDelays[0] +
                        (ulong)((uVar1 >> 0x18) << 7) + (ulong)(uVar1 >> 0x18) * 4);
      if (pIVar3->fVarPinDelays == 0) {
        if (0xffffff < uVar1) {
          pVVar4 = p->vObjs;
          uVar7 = 0;
          do {
            fVar11 = (&pCut[1].Area)[uVar7];
            if (((long)(int)fVar11 < 0) || (pVVar4->nSize <= (int)fVar11)) goto LAB_00436faf;
            pvVar5 = pVVar4->pArray[(int)fVar11];
            if (pvVar5 == (void *)0x0) {
              return;
            }
            fVar10 = ObjRequired - *pfVar9;
            fVar11 = *(float *)((long)pvVar5 + 0x34);
            if (fVar10 <= *(float *)((long)pvVar5 + 0x34)) {
              fVar11 = fVar10;
            }
            *(float *)((long)pvVar5 + 0x34) = fVar11;
            uVar7 = uVar7 + 1;
          } while (uVar7 < (byte)pCut->field_0x1f);
        }
      }
      else {
        piVar8 = If_CutPropagateRequired::pPinPerm;
        If_CutSortInputPins(p,pCut,If_CutPropagateRequired::pPinPerm,
                            If_CutPropagateRequired::pPinDelays);
        if (0xffffff < *(uint *)&pCut->field_0x1c) {
          pVVar4 = p->vObjs;
          uVar7 = 0;
          do {
            fVar11 = (&pCut[1].Area)[*piVar8];
            if (((long)(int)fVar11 < 0) || (pVVar4->nSize <= (int)fVar11)) {
LAB_00436faf:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            fVar10 = ObjRequired - pfVar9[uVar7];
            pvVar5 = pVVar4->pArray[(int)fVar11];
            fVar11 = *(float *)((long)pvVar5 + 0x34);
            if (fVar10 <= fVar11) {
              fVar11 = fVar10;
            }
            *(float *)((long)pvVar5 + 0x34) = fVar11;
            uVar7 = uVar7 + 1;
            piVar8 = piVar8 + 1;
          } while (uVar7 < (byte)pCut->field_0x1f);
        }
      }
    }
  }
  return;
}

Assistant:

void If_CutPropagateRequired( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut, float ObjRequired )
{
    static int pPinPerm[IF_MAX_LUTSIZE];
    static float pPinDelays[IF_MAX_LUTSIZE];
    If_Obj_t * pLeaf;
    float * pLutDelays;
    float Required;
    int i, Pin2PinDelay;//, iLeaf;
    assert( !p->pPars->fLiftLeaves );
    // compute the pins
    if ( pCut->fAndCut )
    {
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            pLeaf->Required = IF_MIN( pLeaf->Required, ObjRequired - p->pPars->nAndDelay );
    }
    else if ( p->pPars->pLutLib )
    {
        pLutDelays = p->pPars->pLutLib->pLutDelays[pCut->nLeaves];
        if ( p->pPars->pLutLib->fVarPinDelays )
        {
            // compute the delay using sorted pins
            If_CutSortInputPins( p, pCut, pPinPerm, pPinDelays );
            for ( i = 0; i < (int)pCut->nLeaves; i++ )
            {
                Required = ObjRequired - pLutDelays[i];
                pLeaf = If_ManObj( p, pCut->pLeaves[pPinPerm[i]] );
                pLeaf->Required = IF_MIN( pLeaf->Required, Required );
            }
        }
        else
        {
            Required = ObjRequired;
            If_CutForEachLeaf( p, pCut, pLeaf, i )
                pLeaf->Required = IF_MIN( pLeaf->Required, Required - pLutDelays[0] );
        }
    }
    else
    {
        if ( pCut->fUser )
        {
            char Perm[IF_MAX_FUNC_LUTSIZE], * pPerm = Perm;
            if ( p->pPars->fDelayOpt )
            {
                int Delay = If_CutSopBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else if ( p->pPars->fDelayOptLut )
            {
                int Delay = If_CutLutBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else if ( p->pPars->fDsdBalance )
            {
                int Delay = If_CutDsdBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else
                pPerm = If_CutPerm(pCut);
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                Pin2PinDelay = pPerm ? (pPerm[i] == IF_BIG_CHAR ? -IF_BIG_CHAR : pPerm[i]) : 1;
                Required = ObjRequired - (float)Pin2PinDelay;
                pLeaf->Required = IF_MIN( pLeaf->Required, Required );
            }
        }
        else
        {
            Required = ObjRequired;
            If_CutForEachLeaf( p, pCut, pLeaf, i )
                pLeaf->Required = IF_MIN( pLeaf->Required, Required - (float)1.0 );
        }
    }
}